

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool,false,false>
               (long *ldata,long *rdata,long *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  bool bVar1;
  long lVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  long rentry_2;
  long lentry_2;
  idx_t i;
  long rentry_1;
  long lentry_1;
  idx_t start;
  long rentry;
  long lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  ValidityMask *in_stack_ffffffffffffff58;
  idx_t in_stack_ffffffffffffff60;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  ulong uVar3;
  idx_t local_78;
  unsigned_long local_70;
  undefined8 local_68;
  undefined8 local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  unsigned_long local_20;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RCX * 8),in_RDX,(void *)((long)in_RDX + in_RCX * 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  AssertRestrictFunction
            (local_10,(void *)((long)local_10 + local_20 * 8),local_18,
             (void *)((long)local_18 + local_20 * 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar1) {
    for (uVar3 = 0; uVar3 < local_20; uVar3 = uVar3 + 1) {
      lVar2 = BinaryStandardOperatorWrapper::
              Operation<bool,duckdb::MultiplyOperatorOverflowCheck,long,long,long>
                        (SUB81(uVar3 >> 0x38,0),*(long *)((long)local_8 + uVar3 * 8),
                         *(long *)((long)local_10 + uVar3 * 8),in_stack_ffffffffffffff58,0x131a67f);
      *(long *)((long)local_18 + uVar3 * 8) = lVar2;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x131a433);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_20);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          local_60 = *(undefined8 *)((long)local_8 + local_38 * 8);
          local_68 = *(undefined8 *)((long)local_10 + local_38 * 8);
          lVar2 = BinaryStandardOperatorWrapper::
                  Operation<bool,duckdb::MultiplyOperatorOverflowCheck,long,long,long>
                            (SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                             (long)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff58,0x131a4f5);
          *(long *)((long)local_18 + local_38 * 8) = lVar2;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_70 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_78 = local_38 - local_70;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_78);
            if (bVar1) {
              lVar2 = BinaryStandardOperatorWrapper::
                      Operation<bool,duckdb::MultiplyOperatorOverflowCheck,long,long,long>
                                (SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                                 (long)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                 in_stack_ffffffffffffff58,0x131a5cf);
              *(long *)((long)local_18 + local_38 * 8) = lVar2;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}